

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O1

int zt_ptr_array_free(zt_ptr_array *array,int free_members)

{
  void *__ptr;
  long lVar1;
  
  if (array != (zt_ptr_array *)0x0) {
    if ((0 < free_members) && (0 < array->count)) {
      lVar1 = 0;
      do {
        __ptr = array->array[lVar1];
        if (__ptr != (void *)0x0) {
          if (array->free_cb == (zt_ptr_array_free_cb)0x0) {
            free(__ptr);
          }
          else {
            (*array->free_cb)(__ptr);
          }
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < array->count);
    }
    if (array->array != (void **)0x0) {
      free(array->array);
      array->array = (void **)0x0;
    }
    free(array);
    return 0;
  }
  return -1;
}

Assistant:

int
zt_ptr_array_free(zt_ptr_array * array, int free_members) {
    int32_t i;

    if (array == NULL) {
        return -1;
    }

    if (free_members > 0) {
        for (i = 0; i < array->count; i++) {
            void * memb;

            if ((memb = array->array[i]) == NULL) {
                continue;
            }

            if (array->free_cb) {
                (array->free_cb)(memb);
            } else {
                zt_free(memb);
            }
        }
    }

    zt_free(array->array);
    zt_free(array);

    return 0;
}